

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void RPCRunLater(string *name,function<void_()> func,int64_t nSeconds)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Logger *pLVar4;
  undefined4 extraout_var_00;
  UniValue *__return_storage_ptr__;
  int64_t in_RDX;
  string *psVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
  *category;
  char **args_2;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  long local_f8;
  int64_t nSeconds_local;
  UniqueLock<GlobalMutex> criticalblock10;
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (timerInterface == (RPCTimerInterface *)0x0) {
    __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"No timer handler registered for RPC",(allocator<char> *)&local_70
              );
    JSONRPCError(__return_storage_ptr__,-0x7f5b,&log_msg);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    args_2 = (char **)0x0;
    nSeconds_local = in_RDX;
    UniqueLock<GlobalMutex>::UniqueLock
              (&criticalblock10,&g_deadline_timers_mutex,"g_deadline_timers_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
               ,0x248,false);
    category = &deadlineTimers_abi_cxx11_;
    psVar5 = name;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_>_>_>_>
    ::erase(&deadlineTimers_abi_cxx11_._M_t,name);
    bVar2 = LogAcceptCategory((LogFlags)category,(Level)psVar5);
    if (bVar2) {
      iVar3 = (*timerInterface->_vptr_RPCTimerInterface[2])();
      local_f8 = CONCAT44(extraout_var,iVar3);
      pLVar4 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar4);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,long,char_const*>
                  (&local_70,(tinyformat *)"queue run of timer %s in %i seconds (using %s)\n",
                   (char *)name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &nSeconds_local,&local_f8,args_2);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        pLVar4 = LogInstance();
        local_70._M_dataplus._M_p = (pointer)0x57;
        local_70._M_string_length = 0x6d3767;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp"
        ;
        source_file._M_len = 0x57;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "RPCRunLater";
        logging_function._M_len = 0xb;
        BCLog::Logger::LogPrintStr(pLVar4,str,logging_function,source_file,0x24a,RPC,Debug);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
    iVar3 = (*timerInterface->_vptr_RPCTimerInterface[3])
                      (timerInterface,nSeconds,nSeconds_local * 1000);
    log_msg._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar3);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<RPCTimerBase,std::default_delete<RPCTimerBase>>>>>
                *)&deadlineTimers_abi_cxx11_,name,
               (unique_ptr<RPCTimerBase,_std::default_delete<RPCTimerBase>_> *)&log_msg);
    if (log_msg._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)log_msg._M_dataplus._M_p + 8))();
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock10.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void RPCRunLater(const std::string& name, std::function<void()> func, int64_t nSeconds)
{
    if (!timerInterface)
        throw JSONRPCError(RPC_INTERNAL_ERROR, "No timer handler registered for RPC");
    LOCK(g_deadline_timers_mutex);
    deadlineTimers.erase(name);
    LogDebug(BCLog::RPC, "queue run of timer %s in %i seconds (using %s)\n", name, nSeconds, timerInterface->Name());
    deadlineTimers.emplace(name, std::unique_ptr<RPCTimerBase>(timerInterface->NewTimer(func, nSeconds*1000)));
}